

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

void __thiscall RigidBodyDynamics::Model::SetBodyMass(Model *this,uint id,double mass)

{
  bool bVar1;
  reference pvVar2;
  uint in_ESI;
  long in_RDI;
  Scalar in_XMM0_Qa;
  FixedBody *fixedbody;
  Body *in_stack_00000600;
  SpatialTransform *in_stack_00000608;
  Body *in_stack_00000610;
  FixedBody *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffec0;
  Model *in_stack_fffffffffffffec8;
  uint in_stack_ffffffffffffff0c;
  Model *in_stack_ffffffffffffff10;
  Body local_90;
  reference local_20;
  Scalar local_18;
  uint local_c;
  
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  bVar1 = IsFixedBodyId(in_stack_fffffffffffffec8,(uint)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  if (bVar1) {
    local_20 = std::
               vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                             *)(in_RDI + 0x300),(ulong)(local_c - *(int *)(in_RDI + 0x318)));
    std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
    operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 800),(ulong)local_20->mMovableParent);
    FixedBody::ToBody(in_stack_fffffffffffffea8);
    Body::Separate(in_stack_00000610,in_stack_00000608,in_stack_00000600);
    Body::~Body(&local_90);
    local_20->mMass = local_18;
    std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
    operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 800),(ulong)local_20->mMovableParent);
    FixedBody::ToBody(in_stack_fffffffffffffea8);
    Body::Join(in_stack_00000610,in_stack_00000608,in_stack_00000600);
    Body::~Body((Body *)&stack0xfffffffffffffef0);
  }
  else {
    pvVar2 = std::
             vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
             operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)(in_RDI + 800),(ulong)local_c);
    pvVar2->mMass = local_18;
  }
  UpdateInertiaMatrixForBody(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  return;
}

Assistant:

void Model::SetBodyMass(const unsigned int id, const double mass)
{
  if(IsFixedBodyId(id))
  {
    // The inertial parameters of the fixed body have already been merged in the parent body,
    // in order to update correctly the parent body we need to first
    // remove the inertial effects of the fixed body from his parent body
    // Then update the fixed body inertia
    // Finally, merge it again in the parent body
    FixedBody& fixedbody(mFixedBodies[id - fixed_body_discriminator]);
    mBodies[fixedbody.mMovableParent].Separate(fixedbody.mParentTransform, fixedbody.ToBody());
    fixedbody.mMass = mass;
    mBodies[fixedbody.mMovableParent].Join(fixedbody.mParentTransform, fixedbody.ToBody());
  }
  else
  {
    mBodies[id].mMass = mass;
  }
  UpdateInertiaMatrixForBody(id);
}